

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReportUnexpectedOpcode
          (BinaryReader *this,Opcode opcode,char *where)

{
  undefined1 auVar1 [8];
  string local_98;
  undefined1 local_78 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  string message;
  Opcode local_34 [2];
  Opcode opcode_local;
  
  local_34[0].enum_ = opcode.enum_;
  std::__cxx11::string::string
            ((string *)
             &bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"unexpected opcode",(allocator *)&local_98);
  if (where != (char *)0x0) {
    std::__cxx11::string::push_back
              ((string *)
               &bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,' ');
    std::__cxx11::string::append
              ((string *)
               &bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,where);
  }
  std::__cxx11::string::append
            ((string *)
             &bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,":");
  Opcode::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,local_34);
  if ((undefined1  [8])
      bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != local_78) {
    for (auVar1 = local_78;
        auVar1 != (undefined1  [8])
                  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start; auVar1 = (undefined1  [8])((long)auVar1 + 1)) {
      StringPrintf_abi_cxx11_(&local_98," 0x%x",(ulong)*(byte *)auVar1);
      std::__cxx11::string::append
                ((string *)
                 &bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
    PrintError(this,"%s",
               bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
    std::__cxx11::string::~string
              ((string *)
               &bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    return (Result)Error;
  }
  __assert_fail("bytes.size() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader.cc"
                ,0xd8,
                "Result wabt::(anonymous namespace)::BinaryReader::ReportUnexpectedOpcode(Opcode, const char *)"
               );
}

Assistant:

Result BinaryReader::ReportUnexpectedOpcode(Opcode opcode,
                                            const char* where) {
  std::string message = "unexpected opcode";
  if (where) {
    message += ' ';
    message += where;
  }

  message += ":";

  std::vector<uint8_t> bytes = opcode.GetBytes();
  assert(bytes.size() > 0);

  for (uint8_t byte: bytes) {
    message += StringPrintf(" 0x%x", byte);
  }

  PrintError("%s", message.c_str());
  return Result::Error;
}